

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::FinalizePsbtRequest,cfd::js::api::json::FinalizePsbtResponse,cfd::js::api::FinalizePsbtRequestStruct,cfd::js::api::FinalizePsbtResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::FinalizePsbtResponseStruct_(const_cfd::js::api::FinalizePsbtRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_570;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_4b8 [4];
  JsonClassBase<cfd::js::api::json::FinalizePsbtResponse> local_498 [4];
  undefined1 local_478 [8];
  FinalizePsbtResponse res_2;
  undefined1 local_3d0 [8];
  FinalizePsbtResponseStruct response;
  FinalizePsbtRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_80 [8];
  FinalizePsbtRequest req;
  function<cfd::js::api::FinalizePsbtResponseStruct_(const_cfd::js::api::FinalizePsbtRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._88_8_ = call_function;
  FinalizePsbtRequest::FinalizePsbtRequest((FinalizePsbtRequest *)local_80);
  core::JsonClassBase<cfd::js::api::json::FinalizePsbtRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::FinalizePsbtRequest> *)local_80,request_message);
  FinalizePsbtRequest::ConvertToStruct
            ((FinalizePsbtRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (FinalizePsbtRequest *)local_80);
  std::
  function<cfd::js::api::FinalizePsbtResponseStruct_(const_cfd::js::api::FinalizePsbtRequestStruct_&)>
  ::operator()((FinalizePsbtResponseStruct *)local_3d0,call_function,
               (FinalizePsbtRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._159_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._96_4_ == 0) {
    FinalizePsbtResponse::FinalizePsbtResponse((FinalizePsbtResponse *)local_478);
    FinalizePsbtResponse::ConvertFromStruct
              ((FinalizePsbtResponse *)local_478,(FinalizePsbtResponseStruct *)local_3d0);
    core::JsonClassBase<cfd::js::api::json::FinalizePsbtResponse>::Serialize_abi_cxx11_(local_498);
    std::__cxx11::string::operator=((string *)this,(string *)local_498);
    std::__cxx11::string::~string((string *)local_498);
    FinalizePsbtResponse::~FinalizePsbtResponse((FinalizePsbtResponse *)local_478);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_570,(InnerErrorResponseStruct *)&response.complete);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_4b8);
    std::__cxx11::string::operator=((string *)this,(string *)local_4b8);
    std::__cxx11::string::~string((string *)local_4b8);
    ErrorResponse::~ErrorResponse(&local_570);
  }
  res_2._159_1_ = 1;
  FinalizePsbtResponseStruct::~FinalizePsbtResponseStruct((FinalizePsbtResponseStruct *)local_3d0);
  FinalizePsbtRequestStruct::~FinalizePsbtRequestStruct
            ((FinalizePsbtRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  FinalizePsbtRequest::~FinalizePsbtRequest((FinalizePsbtRequest *)local_80);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}